

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vsscanf.c
# Opt level: O3

int main(void)

{
  int iVar1;
  long lVar2;
  char *pcVar3;
  char *pcVar4;
  byte bVar5;
  int i;
  int n;
  uint u;
  char source [100];
  char buffer [100];
  int local_11c;
  int local_118;
  int local_114;
  int *local_110;
  char local_108 [96];
  undefined4 local_a8;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined4 local_38;
  
  bVar5 = 0;
  builtin_strncpy(local_108,"foo",4);
  iVar1 = testscanf(local_108,"%3c",&local_98);
  if (iVar1 != 1) {
    main_cold_1();
  }
  if (local_98._2_1_ != 'o' || (short)(int)local_98 != 0x6f66) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0xc,"memcmp( buffer, \"foo\", 3 ) == 0");
  }
  local_108[2] = 0;
  local_108[0] = '%';
  local_108[1] = 0x78;
  iVar1 = testscanf(local_108,"%%%c%n",&local_98,&local_118);
  if (iVar1 != 1) {
    main_cold_2();
  }
  if (local_118 != 2) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x10,"n == 2");
  }
  if ((char)local_98 != 'x') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x11,"buffer[0] == \'x\'");
  }
  builtin_strncpy(local_108,"abcdefg",8);
  iVar1 = testscanf(local_108,"%*[cba]%n",&local_118);
  if (iVar1 != 0) {
    main_cold_3();
  }
  if (local_118 != 3) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x14,"n == 3");
  }
  builtin_strncpy(local_108,"foo",4);
  iVar1 = testscanf(local_108,"%*s%n",&local_118);
  if (iVar1 != 0) {
    main_cold_4();
  }
  if (local_118 != 3) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x16,"n == 3");
  }
  builtin_strncpy(local_108,"abc",4);
  iVar1 = testscanf(local_108,"%*c%n",&local_118);
  if (iVar1 != 0) {
    main_cold_5();
  }
  if (local_118 != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x18,"n == 1");
  }
  builtin_strncpy(local_108,"3xfoo",6);
  iVar1 = testscanf(local_108,"%*dx%3c",&local_98);
  if (iVar1 != 1) {
    main_cold_6();
  }
  if (local_98._2_1_ != 'o' || (short)(int)local_98 != 0x6f66) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x1a,"memcmp( buffer, \"foo\", 3 ) == 0");
  }
  builtin_strncpy(local_108,"-2147483648",0xc);
  iVar1 = testscanf(local_108,"%d",&local_11c);
  if (iVar1 != 1) {
    main_cold_7();
  }
  TEST_RESULTS = TEST_RESULTS + 1;
  printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
         ,0x1e,"i == INT_MIN");
  builtin_strncpy(local_108,"2147483647",0xb);
  iVar1 = testscanf(local_108,"%d",&local_11c);
  if (iVar1 != 1) {
    main_cold_8();
  }
  if (local_11c != 0x7fffffff) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x20,"i == INT_MAX");
  }
  local_108[2] = 0;
  local_108[0] = '-';
  local_108[1] = 0x31;
  iVar1 = testscanf(local_108,"%d",&local_11c);
  if (iVar1 != 1) {
    main_cold_9();
  }
  if (local_11c != -1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x22,"i == -1");
  }
  local_108[0] = '0';
  local_108[1] = 0;
  iVar1 = testscanf(local_108,"%d",&local_11c);
  if (iVar1 != 1) {
    main_cold_10();
  }
  if (local_11c != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x24,"i == 0");
  }
  local_108[0] = '1';
  local_108[1] = 0;
  iVar1 = testscanf(local_108,"%d",&local_11c);
  if (iVar1 != 1) {
    main_cold_11();
  }
  if (local_11c != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x26,"i == 1");
  }
  builtin_strncpy(local_108,"-2147483648",0xc);
  iVar1 = testscanf(local_108,"%i",&local_11c);
  if (iVar1 != 1) {
    main_cold_12();
  }
  TEST_RESULTS = TEST_RESULTS + 1;
  printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
         ,0x28,"i == INT_MIN");
  builtin_strncpy(local_108,"2147483647",0xb);
  iVar1 = testscanf(local_108,"%i",&local_11c);
  if (iVar1 != 1) {
    main_cold_13();
  }
  if (local_11c != 0x7fffffff) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x2a,"i == INT_MAX");
  }
  local_108[2] = 0;
  local_108[0] = '-';
  local_108[1] = 0x31;
  iVar1 = testscanf(local_108,"%i",&local_11c);
  if (iVar1 != 1) {
    main_cold_14();
  }
  if (local_11c != -1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x2c,"i == -1");
  }
  local_108[0] = '0';
  local_108[1] = 0;
  iVar1 = testscanf(local_108,"%i",&local_11c);
  if (iVar1 != 1) {
    main_cold_15();
  }
  if (local_11c != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x2e,"i == 0");
  }
  local_108[0] = '1';
  local_108[1] = 0;
  iVar1 = testscanf(local_108,"%i",&local_11c);
  if (iVar1 != 1) {
    main_cold_16();
  }
  if (local_11c != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x30,"i == 1");
  }
  builtin_strncpy(local_108,"0x7FFFFFFF",0xb);
  iVar1 = testscanf(local_108,"%i",&local_11c);
  if (iVar1 != 1) {
    main_cold_17();
  }
  if (local_11c != 0x7fffffff) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x32,"i == INT_MAX");
  }
  builtin_strncpy(local_108,"0x0",4);
  iVar1 = testscanf(local_108,"%i",&local_11c);
  if (iVar1 != 1) {
    main_cold_18();
  }
  if (local_11c != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x34,"i == 0");
  }
  local_108[2] = 0;
  local_108[0] = '0';
  local_108[1] = 0x30;
  iVar1 = testscanf(local_108,"%i%n",&local_11c,&local_118);
  if (iVar1 != 1) {
    main_cold_19();
  }
  if (local_11c != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x37,"i == 0");
  }
  if (local_118 != 2) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x38,"n == 2");
  }
  builtin_strncpy(local_108,"4294967295",0xb);
  iVar1 = testscanf(local_108,"%u",&local_114);
  if (iVar1 != 1) {
    main_cold_20();
  }
  if (local_114 != -1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x3c,"u == UINT_MAX");
  }
  local_108[0] = '0';
  local_108[1] = 0;
  iVar1 = testscanf(local_108,"%u",&local_114);
  if (iVar1 != 1) {
    main_cold_21();
  }
  if (local_114 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x3e,"u == 0");
  }
  builtin_strncpy(local_108,"fFFFFFFF",9);
  iVar1 = testscanf(local_108,"%x",&local_114);
  if (iVar1 != 1) {
    main_cold_22();
  }
  if (local_114 != -1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x40,"u == UINT_MAX");
  }
  builtin_strncpy(local_108,"7FFFFFFF",9);
  iVar1 = testscanf(local_108,"%x",&local_114);
  if (iVar1 != 1) {
    main_cold_23();
  }
  if (local_114 != 0x7fffffff) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x42,"u == INT_MAX");
  }
  local_108[0] = '0';
  local_108[1] = 0;
  iVar1 = testscanf(local_108,"%o",&local_114);
  if (iVar1 != 1) {
    main_cold_24();
  }
  if (local_114 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x44,"u == 0");
  }
  builtin_strncpy(local_108,"37777777777",0xc);
  iVar1 = testscanf(local_108,"%o",&local_114);
  if (iVar1 != 1) {
    main_cold_25();
  }
  if (local_114 != -1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x46,"u == UINT_MAX");
  }
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_98 = 0;
  uStack_90 = 0;
  local_38 = 0;
  local_108[0] = 'x';
  local_108[1] = 0;
  iVar1 = testscanf(local_108,"%c");
  if (iVar1 != 1) {
    main_cold_26();
  }
  if ((short)local_98 != 0x78) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x4a,"memcmp( buffer, \"x\\0\", 2 ) == 0");
  }
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_98 = 0;
  uStack_90 = 0;
  local_38 = 0;
  builtin_strncpy(local_108,"foo bar",8);
  iVar1 = testscanf(local_108,"%s%n",&local_98,&local_118);
  if (iVar1 != 1) {
    main_cold_27();
  }
  if ((int)local_98 != 0x6f6f66) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x4f,"memcmp( buffer, \"foo\\0\", 4 ) == 0");
  }
  if (local_118 != 3) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x50,"n == 3");
  }
  builtin_strncpy(local_108,"foo bar  baz",0xd);
  iVar1 = testscanf(local_108,"%s %s %n",&local_98,(long)&local_98 + 4,&local_118);
  if (iVar1 != 2) {
    main_cold_28();
  }
  if (local_118 != 9) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x52,"n == 9");
  }
  if (local_98 != 0x726162006f6f66) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x53,"memcmp( buffer, \"foo\\0bar\\0\", 8 ) == 0");
  }
  builtin_strncpy(local_108,"abcdefg",8);
  iVar1 = testscanf(local_108,"%[cba]",&local_98);
  if (iVar1 != 1) {
    main_cold_29();
  }
  if ((int)local_98 != 0x636261) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x57,"memcmp( buffer, \"abc\\0\", 4 ) == 0");
  }
  local_108[0] = '\0';
  iVar1 = testscanf(local_108,"%[cba]",&local_98);
  if (iVar1 != -1) {
    main_cold_30();
  }
  local_108[0] = '3';
  local_108[1] = 0;
  iVar1 = testscanf(local_108,"%u%[cba]",&local_114,&local_98);
  if (iVar1 != 1) {
    main_cold_31();
  }
  sprintf((char *)&local_98,"%p",0);
  pcVar3 = (char *)&local_98;
  pcVar4 = local_108;
  for (lVar2 = 0xc; lVar2 != 0; lVar2 = lVar2 + -1) {
    *(undefined8 *)pcVar4 = *(undefined8 *)pcVar3;
    pcVar3 = pcVar3 + (ulong)bVar5 * -0x10 + 8;
    pcVar4 = pcVar4 + (ulong)bVar5 * -0x10 + 8;
  }
  local_a8 = local_38;
  local_110 = &local_11c;
  iVar1 = testscanf(local_108,"%p");
  if (iVar1 != 1) {
    main_cold_32();
  }
  if (local_110 != (int *)0x0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x61,"p == NULL");
  }
  local_110 = &local_11c;
  sprintf((char *)&local_98,"%p",&local_11c);
  local_110 = (int *)0x0;
  pcVar3 = (char *)&local_98;
  pcVar4 = local_108;
  for (lVar2 = 0xc; lVar2 != 0; lVar2 = lVar2 + -1) {
    *(undefined8 *)pcVar4 = *(undefined8 *)pcVar3;
    pcVar3 = pcVar3 + (ulong)bVar5 * -0x10 + 8;
    pcVar4 = pcVar4 + (ulong)bVar5 * -0x10 + 8;
  }
  local_a8 = local_38;
  iVar1 = testscanf(local_108,"%p",&local_110);
  if (iVar1 != 1) {
    main_cold_33();
  }
  if (local_110 != &local_11c) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x66,"p == &i");
  }
  local_108[0] = '\0';
  iVar1 = testscanf(local_108,"%d",&local_11c);
  if (iVar1 != -1) {
    main_cold_34();
  }
  builtin_strncpy(local_108,"foo",4);
  iVar1 = testscanf(local_108,"%5c",&local_98);
  if (iVar1 != 1) {
    main_cold_35();
  }
  if (local_98._2_1_ != 'o' || (short)local_98 != 0x6f66) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/test_support/scanf_testcases.h, line %d - %s\n"
           ,0x6a,"memcmp( buffer, \"foo\", 3 ) == 0");
  }
  return TEST_RESULTS;
}

Assistant:

int main( void )
{
    char source[100];
#include "scanf_testcases.h"
    return TEST_RESULTS;
}